

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O1

SVInt __thiscall slang::SVInt::lshr(SVInt *this,bitwidth_t amount)

{
  bool bVar1;
  uint bits;
  uint64_t *src;
  ulong uVar2;
  uint64_t *dst;
  byte bVar3;
  bool bVar4;
  uint in_EDX;
  undefined8 extraout_RDX;
  uint64_t uVar5;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar6;
  undefined4 in_register_00000034;
  SVIntStorage *other;
  ulong uVar7;
  uint32_t numWords;
  uint numWords_00;
  long lVar8;
  long lVar9;
  SVInt SVar10;
  
  other = (SVIntStorage *)CONCAT44(in_register_00000034,amount);
  if (in_EDX == 0) {
    SVInt(this,other);
    uVar6 = extraout_RDX;
  }
  else {
    bits = other->bitWidth;
    if (in_EDX < bits) {
      bVar4 = other->unknownFlag;
      bVar3 = (byte)in_EDX;
      if (0x40 < bits || (bVar4 & 1U) != 0) {
        bVar1 = other->signFlag;
        numWords_00 = bits + 0x3f >> 6;
        uVar7 = (ulong)((numWords_00 << (bVar4 & 0x1fU)) << 3);
        dst = (uint64_t *)operator_new__(uVar7);
        memset(dst,0,uVar7);
        (this->super_SVIntStorage).field_0.pVal = dst;
        (this->super_SVIntStorage).bitWidth = bits;
        (this->super_SVIntStorage).signFlag = bVar1;
        (this->super_SVIntStorage).unknownFlag = bVar4;
        if (in_EDX < 0x40 && (bVar4 & 1U) == 0) {
          if (0x3f < bits + 0x3f) {
            uVar5 = (other->field_0).val;
            uVar7 = 0;
            lVar8 = (ulong)((numWords_00 << (bVar4 & 0x1fU)) - 1) + 1;
            do {
              uVar2 = *(ulong *)((uVar5 - 8) + lVar8 * 8);
              dst[lVar8 + -1] = uVar2 >> (bVar3 & 0x3f) | uVar7;
              lVar9 = lVar8 + -1;
              bVar4 = 0 < lVar8;
              uVar7 = uVar2 << (0x40 - bVar3 & 0x3f);
              lVar8 = lVar9;
            } while (lVar9 != 0 && bVar4);
          }
        }
        else {
          src = (other->field_0).pVal;
          lshrFar(dst,src,in_EDX & 0x3f,in_EDX >> 6,0,numWords_00);
          if ((bVar4 & 1U) != 0) {
            lshrFar(dst,src,in_EDX & 0x3f,in_EDX >> 6,numWords_00,numWords_00);
          }
        }
        checkUnknown(this);
        uVar6 = extraout_RDX_01;
        goto LAB_00191669;
      }
      uVar5 = (other->field_0).val >> (bVar3 & 0x3f);
      bVar4 = other->signFlag;
    }
    else {
      bVar4 = other->signFlag;
      uVar5 = 0;
    }
    SVInt(this,bits,uVar5,bVar4);
    uVar6 = extraout_RDX_00;
  }
LAB_00191669:
  SVar10.super_SVIntStorage.bitWidth = (int)uVar6;
  SVar10.super_SVIntStorage.signFlag = (bool)(char)((ulong)uVar6 >> 0x20);
  SVar10.super_SVIntStorage.unknownFlag = (bool)(char)((ulong)uVar6 >> 0x28);
  SVar10.super_SVIntStorage._14_2_ = (short)((ulong)uVar6 >> 0x30);
  SVar10.super_SVIntStorage.field_0.pVal = (uint64_t *)this;
  return (SVInt)SVar10.super_SVIntStorage;
}

Assistant:

SVInt SVInt::lshr(bitwidth_t amount) const {
    // handle trivial cases
    if (amount == 0)
        return *this;
    if (amount >= bitWidth) // if the shift amount is too large, we end up with zero anyway
        return SVInt(bitWidth, 0, signFlag);
    if (isSingleWord())
        return SVInt(bitWidth, val >> amount, signFlag);

    // handle the small shift case
    SVInt result = allocZeroed(bitWidth, signFlag, unknownFlag);
    if (amount < BITS_PER_WORD && !unknownFlag)
        lshrNear(result.pVal, pVal, getNumWords(), amount);
    else {
        // otherwise do a full shift
        uint32_t numWords = getNumWords(bitWidth, false);
        uint32_t wordShift = amount % BITS_PER_WORD;
        uint32_t offset = amount / BITS_PER_WORD;

        // also handle shifting the unknown bits if necessary
        lshrFar(result.pVal, pVal, wordShift, offset, 0, numWords);
        if (unknownFlag)
            lshrFar(result.pVal, pVal, wordShift, offset, numWords, numWords);
    }

    result.checkUnknown();
    return result;
}